

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestPhonySelfReference::RegisterBuildTestPhonySelfReference
          (RegisterBuildTestPhonySelfReference *this)

{
  RegisterBuildTestPhonySelfReference *this_local;
  
  RegisterTest(BuildTestPhonySelfReference::Create,"BuildTest.PhonySelfReference");
  return;
}

Assistant:

TEST_F(BuildTest, PhonySelfReference) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a: phony a\n"));

  EXPECT_TRUE(builder_.AddTarget("a", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}